

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrVec.h
# Opt level: O3

StrVec * __thiscall StrVec::operator=(StrVec *this,StrVec *rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last;
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string *psVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"StrVec copy assignment.",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pbVar2 = rhs->elements;
  __last = rhs->first_free;
  __result = __gnu_cxx::
             new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::allocate((new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&alloc_abi_cxx11_,(long)__last - (long)pbVar2 >> 5,(void *)0x0);
  pbVar2 = std::__uninitialized_copy<false>::
           __uninit_copy<std::__cxx11::string_const*,std::__cxx11::string*>(pbVar2,__last,__result);
  psVar3 = this->elements;
  if (psVar3 != (string *)0x0) {
    if (this->first_free != psVar3) {
      paVar4 = &this->first_free[-1].field_2;
      do {
        plVar1 = (long *)(((string *)(paVar4 + -1))->_M_dataplus)._M_p;
        if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar1) {
          operator_delete(plVar1,paVar4->_M_allocated_capacity + 1);
          psVar3 = this->elements;
        }
        psVar5 = (string *)(paVar4 + -1);
        paVar4 = paVar4 + -2;
      } while (psVar5 != psVar3);
    }
    operator_delete(psVar3,(long)this->cap - (long)psVar3);
  }
  this->elements = __result;
  this->cap = pbVar2;
  this->first_free = pbVar2;
  return this;
}

Assistant:

inline
StrVec& StrVec::operator=(const StrVec& rhs)
{
	std::cout << "StrVec copy assignment." << std::endl;
	// call alloc_n_copy to allocate exactly as many elements as in rhs
	auto data = alloc_n_copy(rhs.begin(), rhs.end());
	free();
	elements = data.first;
	first_free = cap = data.second;
	return *this;
}